

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *fieldPosition,
          UErrorCode *status)

{
  Type TVar1;
  UDate date;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    TVar1 = Formattable::getType(obj);
    if (TVar1 == kLong) {
      date = (UDate)*(int *)&obj->fValue;
    }
    else {
      if ((TVar1 != kDouble) && (TVar1 != kDate)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
      }
      date = (obj->fValue).fDate;
    }
    format(this,date,appendTo,fieldPosition);
  }
  return appendTo;
}

Assistant:

UnicodeString&
DateFormat::format(const Formattable& obj,
                   UnicodeString& appendTo,
                   FieldPosition& fieldPosition,
                   UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    // if the type of the Formattable is double or long, treat it as if it were a Date
    UDate date = 0;
    switch (obj.getType())
    {
    case Formattable::kDate:
        date = obj.getDate();
        break;
    case Formattable::kDouble:
        date = (UDate)obj.getDouble();
        break;
    case Formattable::kLong:
        date = (UDate)obj.getLong();
        break;
    default:
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }

    // Is this right?
    //if (fieldPosition.getBeginIndex() == fieldPosition.getEndIndex())
    //  status = U_ILLEGAL_ARGUMENT_ERROR;

    return format(date, appendTo, fieldPosition);
}